

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_cmetrohash64_1.c
# Opt level: O2

void cmetrohash64_1_optshort(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint8_t *puVar5;
  uint *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  
  uVar4 = len + 0x60e25d3baf065edb + (ulong)seed * 0xc83a91e1;
  switch(len) {
  case 0:
    goto switchD_00164ca7_caseD_0;
  case 1:
    uVar7 = (ulong)*key;
    break;
  case 2:
    uVar7 = (ulong)*(ushort *)key;
    goto LAB_00165aee;
  case 3:
    uVar4 = (ulong)*(ushort *)key * 0x2f5870a5 + uVar4;
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[2];
    break;
  case 4:
    uVar12 = (ulong)*(uint *)key;
    goto LAB_00165970;
  case 5:
    uVar4 = (ulong)*(uint *)key * 0x2f5870a5 + uVar4;
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[4];
    break;
  case 6:
    uVar4 = (ulong)*(uint *)key * 0x2f5870a5 + uVar4;
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)*(ushort *)(key + 4);
    goto LAB_00165aee;
  case 7:
    uVar4 = (ulong)*(uint *)key * 0x2f5870a5 + uVar4;
    uVar4 = (ulong)*(ushort *)(key + 4) * 0x2f5870a5 +
            ((uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[6];
    break;
  case 8:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    goto LAB_00165483;
  case 9:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[8];
    break;
  case 10:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)*(ushort *)(key + 8);
    goto LAB_00165aee;
  case 0xb:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    uVar4 = (ulong)*(ushort *)(key + 8) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[10];
    break;
  case 0xc:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
    uVar12 = (ulong)*(uint *)(key + 8);
    goto LAB_00165970;
  case 0xd:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    uVar4 = (ulong)*(uint *)(key + 8) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0xc];
    break;
  case 0xe:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    uVar4 = (ulong)*(uint *)(key + 8) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)*(ushort *)(key + 0xc);
    goto LAB_00165aee;
  case 0xf:
    uVar4 = *(long *)key * 0x2f5870a5 + uVar4;
    uVar4 = (ulong)*(uint *)(key + 8) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (ulong)*(ushort *)(key + 0xc) * 0x2f5870a5 +
            ((uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0xe];
    break;
  case 0x10:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b) + uVar4;
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) ^ uVar4;
    goto LAB_00165b0e;
  case 0x11:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = (ulong)key[0x10] * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    goto LAB_00165a46;
  case 0x12:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = (ulong)*(ushort *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    goto LAB_00165af8;
  case 0x13:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = (ulong)*(ushort *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0x12];
    break;
  case 0x14:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = (ulong)*(uint *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    goto LAB_0016597a;
  case 0x15:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = (ulong)*(uint *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0x14];
    break;
  case 0x16:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = (ulong)*(uint *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)*(ushort *)(key + 0x14);
    goto LAB_00165aee;
  case 0x17:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = (ulong)*(uint *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (ulong)*(ushort *)(key + 0x14) * 0x2f5870a5 +
            ((uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0x16];
    break;
  case 0x18:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
LAB_00165483:
    uVar7 = uVar4 >> 0x21 | uVar4 << 0x1f;
    goto LAB_00165afe;
  case 0x19:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar10 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar12 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar10 = uVar10 >> 0x21 | uVar10 * 0x80000000;
    uVar7 = (ulong)key[0x18];
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar10 * -0x3981893f20000000 | uVar10 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar12 * 0x4645c8cf60000000 | uVar12 * 0x6907a4ca322e467b >> 0x23) +
              uVar10 * 0x7bdec03b ^ uVar12 * 0x8648dbdb) ^ uVar10 * 0x7bdec03b);
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
    break;
  case 0x1a:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar10 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar12 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar10 = uVar10 >> 0x21 | uVar10 * 0x80000000;
    uVar7 = (ulong)*(ushort *)(key + 0x18);
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar10 * -0x3981893f20000000 | uVar10 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar12 * 0x4645c8cf60000000 | uVar12 * 0x6907a4ca322e467b >> 0x23) +
              uVar10 * 0x7bdec03b ^ uVar12 * 0x8648dbdb) ^ uVar10 * 0x7bdec03b);
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
    goto LAB_00165aee;
  case 0x1b:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (ulong)*(ushort *)(key + 0x18) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0x1a];
    break;
  case 0x1c:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar10 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar12 = (ulong)*(uint *)(key + 0x18);
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar10 * -0x3981893f20000000 | uVar10 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar10 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar10 * 0x7bdec03b);
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
LAB_00165970:
    uVar4 = uVar12 * 0x2f5870a5 + uVar4;
LAB_0016597a:
    uVar7 = uVar4 >> 0xf | uVar4 << 0x31;
    goto LAB_00165afe;
  case 0x1d:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (ulong)*(uint *)(key + 0x18) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0x1c];
    break;
  case 0x1e:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (ulong)*(uint *)(key + 0x18) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)*(ushort *)(key + 0x1c);
LAB_00165aee:
    uVar4 = uVar7 * 0x2f5870a5 + uVar4;
LAB_00165af8:
    uVar7 = uVar4 >> 0xd | uVar4 << 0x33;
    goto LAB_00165afe;
  case 0x1f:
    uVar7 = *(long *)key * 0xc83a91e1 + uVar4;
    uVar12 = *(long *)(key + 8) * 0x8648dbdb + uVar4;
    uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
    uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
    uVar4 = *(long *)(key + 0x10) * 0x2f5870a5 + uVar4 +
            ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
             ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
              uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    uVar4 = (ulong)*(uint *)(key + 0x18) * 0x2f5870a5 +
            ((uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4);
    uVar4 = (ulong)*(ushort *)(key + 0x1c) * 0x2f5870a5 +
            ((uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4);
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    uVar7 = (ulong)key[0x1e];
    break;
  default:
    auVar3 = vpmovzxdq_avx(ZEXT816(0x8648dbdbc83a91e1));
    auVar2 = vpmovsxdq_avx(ZEXT816(0x2f5870a57bdec03b));
    auVar13 = vpbroadcastq_avx512vl();
    lVar9 = 0;
    auVar16 = auVar13;
    do {
      lVar8 = lVar9;
      puVar5 = key + lVar8 + 0x20;
      lVar9 = lVar8 + 0x20;
      auVar14 = vpmullq_avx512vl(auVar3,*(undefined1 (*) [16])(puVar5 + -0x20));
      auVar15 = vpmullq_avx512vl(auVar2,*(undefined1 (*) [16])(puVar5 + -0x10));
      auVar13 = vpaddq_avx(auVar14,auVar13);
      auVar13 = vprolq_avx512vl(auVar13,0x23);
      auVar13 = vpaddq_avx(auVar13,auVar16);
      auVar16 = vpaddq_avx(auVar15,auVar16);
      auVar16 = vprolq_avx512vl(auVar16,0x23);
      auVar16 = vpaddq_avx(auVar16,auVar13);
    } while (puVar5 <= key + (len - 0x20));
    uVar17 = auVar13._0_8_;
    uVar7 = vpextrq_avx(auVar16,1);
    uVar11 = vpextrq_avx(auVar13,1);
    uVar12 = (uVar7 + uVar17) * 0xc83a91e1 + uVar11;
    uVar10 = auVar16._0_8_ ^ (uVar12 >> 0x21 | uVar12 * 0x80000000) * 0x8648dbdb;
    uVar12 = (uVar10 + uVar11) * 0x8648dbdb + uVar17;
    uVar7 = (uVar12 >> 0x21 | uVar12 * 0x80000000) * 0xc83a91e1 ^ uVar7;
    uVar12 = (uVar10 + uVar17) * 0xc83a91e1 + uVar7;
    uVar10 = (uVar7 + uVar11) * 0x8648dbdb + uVar10;
    uVar4 = ((uVar12 >> 0x21 | uVar12 * 0x80000000) * 0x8648dbdb ^ uVar17 ^ uVar11 ^
            (uVar10 >> 0x21 | uVar10 * 0x80000000) * 0xc83a91e1) + uVar4;
    puVar5 = (uint8_t *)(len - lVar9);
    if ((long)puVar5 < 0x10) {
      puVar6 = (uint *)(key + lVar9);
    }
    else {
      puVar6 = (uint *)(key + lVar8 + 0x30);
      puVar5 = (uint8_t *)((len - lVar9) + -0x10);
      uVar7 = *(long *)(puVar6 + -4) * 0xc83a91e1 + uVar4;
      uVar12 = *(long *)(puVar6 + -2) * 0x8648dbdb + uVar4;
      uVar7 = uVar7 >> 0x21 | uVar7 * 0x80000000;
      uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
      uVar4 = uVar4 + ((uVar12 * -0x3981893f20000000 | uVar12 * 0x16e8b05e33f3b607 >> 0x23) +
                       ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
                        uVar12 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar12 * 0x7bdec03b);
    }
    if (7 < (long)puVar5) {
      lVar9 = *(long *)puVar6;
      puVar6 = puVar6 + 2;
      uVar4 = lVar9 * 0x2f5870a5 + uVar4;
      uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
      puVar5 = key + (len - (long)puVar6);
    }
    if (3 < (long)puVar5) {
      uVar1 = *puVar6;
      puVar6 = puVar6 + 1;
      uVar4 = (ulong)uVar1 * 0x2f5870a5 + uVar4;
      uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
      puVar5 = key + (len - (long)puVar6);
    }
    if (1 < (long)puVar5) {
      uVar1 = *puVar6;
      puVar6 = (uint *)((long)puVar6 + 2);
      puVar5 = key + (len - (long)puVar6);
      uVar4 = (ulong)(ushort)uVar1 * 0x2f5870a5 + uVar4;
      uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
    }
    if (0 < (long)puVar5) {
      uVar4 = (ulong)(byte)*puVar6 * 0x2f5870a5 + uVar4;
      uVar4 = (uVar4 >> 0x19 | uVar4 << 0x27) * 0x8648dbdb ^ uVar4;
    }
    uVar4 = (uVar4 >> 0x21 | uVar4 << 0x1f) ^ uVar4;
    goto LAB_00165b0e;
  }
  uVar4 = uVar7 * 0x2f5870a5 + uVar4;
LAB_00165a46:
  uVar7 = uVar4 >> 0x19 | uVar4 << 0x27;
LAB_00165afe:
  uVar4 = uVar7 * 0x8648dbdb ^ uVar4;
switchD_00164ca7_caseD_0:
  uVar4 = (uVar4 >> 0x21 | uVar4 << 0x1f) ^ uVar4;
LAB_00165b0e:
  *(ulong *)out = (uVar4 * 0x641d48f080000000 | uVar4 * 0xc83a91e1 >> 0x21) ^ uVar4 * 0xc83a91e1;
  return;
}

Assistant:

void cmetrohash64_1_optshort(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xC83A91E1;
    static const uint64_t k1 = 0x8648DBDB;
    static const uint64_t k2 = 0x7BDEC03B;
    static const uint64_t k3 = 0x2F5870A5;

    const uint8_t * ptr = key;
    const uint8_t * const end = ptr + len;
    
    uint64_t hash = ((((uint64_t) seed) + k2) * k0) + len;


	switch (len) {
	default:
		if (len >= 32)
		{
			uint64_t v[4];
			v[0] = hash;
			v[1] = hash;
			v[2] = hash;
			v[3] = hash;

			do
			{
				v[0] += cread_u64(ptr) * k0; ptr += 8; v[0] = crotate_right(v[0], 29) + v[2];
				v[1] += cread_u64(ptr) * k1; ptr += 8; v[1] = crotate_right(v[1], 29) + v[3];
				v[2] += cread_u64(ptr) * k2; ptr += 8; v[2] = crotate_right(v[2], 29) + v[0];
				v[3] += cread_u64(ptr) * k3; ptr += 8; v[3] = crotate_right(v[3], 29) + v[1];
			} while (ptr <= (end - 32));

			v[2] ^= crotate_right(((v[0] + v[3]) * k0) + v[1], 33) * k1;
			v[3] ^= crotate_right(((v[1] + v[2]) * k1) + v[0], 33) * k0;
			v[0] ^= crotate_right(((v[0] + v[2]) * k0) + v[3], 33) * k1;
			v[1] ^= crotate_right(((v[1] + v[3]) * k1) + v[2], 33) * k0;
			hash += v[0] ^ v[1];
		}

		if ((end - ptr) >= 16)
		{
			uint64_t v0 = hash + (cread_u64(ptr) * k0); ptr += 8; v0 = crotate_right(v0, 33) * k1;
			uint64_t v1 = hash + (cread_u64(ptr) * k1); ptr += 8; v1 = crotate_right(v1, 33) * k2;
			v0 ^= crotate_right(v0 * k0, 35) + v1;
			v1 ^= crotate_right(v1 * k3, 35) + v0;
			hash += v1;
		}

		if ((end - ptr) >= 8)
		{
			hash += cread_u64(ptr) * k3; ptr += 8;
			hash ^= crotate_right(hash, 33) * k1;

		}

		if ((end - ptr) >= 4)
		{
			hash += cread_u32(ptr) * k3; ptr += 4;
			hash ^= crotate_right(hash, 15) * k1;
		}

		if ((end - ptr) >= 2)
		{
			hash += cread_u16(ptr) * k3; ptr += 2;
			hash ^= crotate_right(hash, 13) * k1;
		}

		if ((end - ptr) >= 1)
		{
			hash += cread_u8(ptr) * k3;
			hash ^= crotate_right(hash, 25) * k1;
		}

		hash ^= crotate_right(hash, 33);
		hash *= k0;
		hash ^= crotate_right(hash, 33);

		memcpy(out, &hash, 8);
		return;

	case 31:
		DO_16
			DO_8
			DO_4
			DO_2
			DO_1
			OUT

	case 30:
		DO_16
			DO_8
			DO_4
			DO_2
			OUT

	case 29:
		DO_16
			DO_8
			DO_4
			DO_1
			OUT

	case 28:
		DO_16
			DO_8
			DO_4
			OUT

	case 27:
		DO_16
			DO_8
			DO_2
			DO_1
			OUT

	case 26:
		DO_16
			DO_8
			DO_2
			OUT

	case 25:
		DO_16
			DO_8
			DO_1
			OUT

	case 24:
		DO_16
			DO_8
			OUT

	case 23:
		DO_16
			DO_4
			DO_2
			DO_1
			OUT

	case 22:
		DO_16
			DO_4
			DO_2
			OUT


	case 21:
		DO_16
			DO_4
			DO_1
			OUT

	case 20:
		DO_16
			DO_4
			OUT

	case 19:
		DO_16
			DO_2
			DO_1
			OUT

	case 18:
		DO_16
			DO_2
			OUT

	case 17:
		DO_16
			DO_1
			OUT

	case 16:
		DO_16
			OUT

	case 15:
		DO_8
			DO_4
			DO_2
			DO_1
			OUT

	case 14:
		DO_8
			DO_4
			DO_2
			OUT

	case 13:
		DO_8
			DO_4
			DO_1
			OUT

	case 12:
		DO_8
			DO_4
			OUT

	case 11:
		DO_8
			DO_2
			DO_1
			OUT

	case 10:
		DO_8
			DO_2
			OUT

	case 9:
		DO_8
			DO_1
			OUT

	case 8:
		DO_8
			OUT
	case 7:
		DO_4
			DO_2
			DO_1
			OUT
	case 6:
		DO_4
			DO_2
			OUT
	case 5:
		DO_4
			DO_1
			OUT
	case 4:
		DO_4
			OUT
	case 3:
		DO_2
			DO_1
			OUT
	case 2:
		DO_2
			OUT
	case 1:
		DO_1

	case 0:
		OUT
	}
}